

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmParseFileScope::cmParseFileScope(cmParseFileScope *this,cmMakefile *mf)

{
  pointer *pppcVar1;
  iterator __position;
  cmCommandContext *local_20;
  
  this->Makefile = mf;
  local_20 = &this->Context;
  (this->Context).Name._M_dataplus._M_p = (pointer)&(this->Context).Name.field_2;
  (this->Context).Name._M_string_length = 0;
  (this->Context).Name.field_2._M_local_buf[0] = '\0';
  (this->Context).Line = 0;
  __position._M_current =
       (mf->ContextStack).
       super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (mf->ContextStack).
      super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmCommandContext_const*,std::allocator<cmCommandContext_const*>>::
    _M_realloc_insert<cmCommandContext_const*>
              ((vector<cmCommandContext_const*,std::allocator<cmCommandContext_const*>> *)
               &mf->ContextStack,__position,&local_20);
  }
  else {
    *__position._M_current = local_20;
    pppcVar1 = &(mf->ContextStack).
                super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  return;
}

Assistant:

cmParseFileScope(cmMakefile* mf)
    : Makefile(mf)
  {
    this->Makefile->ContextStack.push_back(&this->Context);
  }